

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

int mixed_buffer_to_pack(mixed_buffer **ins,mixed_pack *out,float *volume,float target_volume)

{
  mixed_encoding encoding;
  mixed_buffer *pmVar1;
  mixed_transfer_function_to p_Var2;
  float *pfVar3;
  long lVar4;
  mixed_pack *pmVar5;
  mixed_buffer **ppmVar6;
  float fVar7;
  void *pvVar8;
  float fVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  float *pfStack_80;
  float ****local_78;
  float *local_70;
  mixed_pack *local_68;
  ulong local_60;
  mixed_buffer **local_58;
  float local_4c;
  void *local_48;
  char *outd;
  uint local_38;
  uint32_t local_34 [2];
  uint32_t frames;
  
  bVar11 = out->channels;
  pfStack_80 = (float *)0x12d5bb;
  local_70 = volume;
  local_58 = ins;
  outd._4_4_ = target_volume;
  bVar10 = mixed_samplesize(out->encoding);
  uVar14 = (uint)bVar10 * (uint)bVar11;
  local_34[0] = 0xffffffff;
  lVar4 = -(ulong)((uint)bVar11 * 8 + 0xf & 0xfffffff0);
  local_78 = (float ****)&local_78;
  local_68 = out;
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d5f9;
  mixed_pack_request_write(&local_48,local_34,out);
  ppmVar6 = local_58;
  local_34[0] = local_34[0] / uVar14;
  local_60 = (ulong)bVar11;
  local_38 = uVar14;
  if (bVar11 != 0) {
    uVar15 = 0;
    do {
      pmVar1 = *(mixed_buffer **)((long)ppmVar6 + uVar15);
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d631;
      mixed_buffer_request_read
                ((float **)((long)&local_78 + uVar15 + lVar4 + -0x78 + 0x78),local_34,pmVar1);
      uVar15 = uVar15 + 8;
    } while ((uint)bVar11 * 8 != uVar15);
  }
  uVar15 = local_60;
  pmVar5 = local_68;
  uVar12 = local_60;
  if (local_34[0] != 0) {
    encoding = local_68->encoding;
    *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d657;
    bVar11 = mixed_samplesize(encoding);
    uVar12 = local_60;
    p_Var2 = transfer_array_functions_to[encoding - MIXED_INT8];
    local_4c = *local_70;
    *local_70 = outd._4_4_;
    if (uVar15 == 0) {
      uVar13 = local_38 * local_34[0];
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d700;
      mixed_pack_finish_write(uVar13,pmVar5);
      return 1;
    }
    cVar16 = '\0';
    do {
      uVar13 = local_34[0];
      fVar9 = outd._4_4_;
      pvVar8 = local_48;
      fVar7 = local_4c;
      pfVar3 = *(float **)((long)&local_78 + (long)cVar16 * 8 + lVar4 + -0x78 + 0x78);
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d6a1;
      (*p_Var2)(pfVar3,pvVar8,(uint8_t)uVar12,uVar13,fVar7,fVar9);
      local_48 = (void *)((long)local_48 + (ulong)bVar11);
      cVar16 = cVar16 + '\x01';
    } while ((int)cVar16 < (int)uVar12);
  }
  pmVar5 = local_68;
  uVar13 = local_38 * local_34[0];
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d6cc;
  mixed_pack_finish_write(uVar13,pmVar5);
  ppmVar6 = local_58;
  if (uVar12 != 0) {
    uVar15 = 0;
    do {
      uVar13 = local_34[0];
      pmVar1 = ppmVar6[uVar15];
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d6e7;
      mixed_buffer_finish_read(uVar13,pmVar1);
      uVar15 = uVar15 + 1;
    } while ((uVar12 & 0xffffffff) != uVar15);
  }
  return 1;
}

Assistant:

int mixed_buffer_to_pack(struct mixed_buffer **ins, struct mixed_pack *out, float *volume, float target_volume){
  mixed_channel_t channels = out->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(out->encoding);
  uint32_t frames = UINT32_MAX;
  char *outd;
  float *ind[channels];

  mixed_pack_request_write((void**)&outd, &frames, out);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_read(&ind[i], &frames, ins[i]);

  if(0 < frames){
    mixed_transfer_function_to fun = transfer_array_functions_to[out->encoding-1];
    uint8_t size = mixed_samplesize(out->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind[c], outd, channels, frames, vol, target_volume);
      outd += size;
    }
  }

  mixed_pack_finish_write(frames * frames_to_bytes, out);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_read(frames, ins[i]);
  
  return 1;
}